

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

ColorEncodingHandle pbrt::ColorEncodingHandle::Get(string *name)

{
  int iVar1;
  pointer pcVar2;
  GammaColorEncoding *this;
  mapped_type *pmVar3;
  char *in_RCX;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  uintptr_t iptr;
  double dVar6;
  float gamma_00;
  string_view str;
  Float gamma;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  float local_54;
  string local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  iVar1 = std::__cxx11::string::compare((char *)in_RSI);
  if (iVar1 == 0) {
    (name->_M_dataplus)._M_p = (pointer)0x0;
    pcVar2 = Linear;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)in_RSI);
    if (iVar1 != 0) {
      if ((char)Get(std::__cxx11::string_const&)::cache == '\0') {
        Get();
      }
      str._M_str = in_RCX;
      str._M_len = (size_t)(in_RSI->_M_dataplus)._M_p;
      SplitStringsFromWhitespace_abi_cxx11_(&local_30,(pbrt *)in_RSI->_M_string_length,str);
      if (((long)local_30.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_30.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x40) &&
         (iVar1 = std::__cxx11::string::compare
                            ((char *)local_30.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start), iVar1 == 0)) {
        dVar6 = atof(local_30.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        gamma_00 = (float)dVar6;
        local_54 = gamma_00;
        if ((gamma_00 == 0.0) && (!NAN(gamma_00))) {
          ErrorExit<std::__cxx11::string&>
                    ("%s: unable to parse gamma value",
                     local_30.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
        }
        p_Var4 = &Get::cache._M_t._M_impl.super__Rb_tree_header._M_header;
        if (Get::cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var4 = &Get::cache._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var5 = Get::cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (gamma_00 <= (float)p_Var5[1]._M_color) {
              p_Var4 = p_Var5;
            }
            p_Var5 = (&p_Var5->_M_left)[(float)p_Var5[1]._M_color < gamma_00];
          } while (p_Var5 != (_Base_ptr)0x0);
        }
        p_Var5 = &Get::cache._M_t._M_impl.super__Rb_tree_header._M_header;
        if (((_Rb_tree_header *)p_Var4 != &Get::cache._M_t._M_impl.super__Rb_tree_header) &&
           (p_Var5 = &Get::cache._M_t._M_impl.super__Rb_tree_header._M_header,
           (float)p_Var4[1]._M_color <= gamma_00)) {
          p_Var5 = p_Var4;
        }
        if ((_Rb_tree_header *)p_Var5 == &Get::cache._M_t._M_impl.super__Rb_tree_header) {
          this = (GammaColorEncoding *)operator_new(0x1404);
          GammaColorEncoding::GammaColorEncoding(this,gamma_00);
          (name->_M_dataplus)._M_p = (pointer)((ulong)this | 0x3000000000000);
          pmVar3 = std::
                   map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                   ::operator[](&Get::cache,&local_54);
          (pmVar3->
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          ).bits = (uintptr_t)(name->_M_dataplus)._M_p;
          if (LOGGING_LogLevel < 1) {
            local_50._M_string_length = 0;
            local_50.field_2._M_local_buf[0] = '\0';
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            detail::
            stringPrintfRecursive<std::__cxx11::string_const&,float&,pbrt::ColorEncodingHandle&>
                      (&local_50,"Added ColorEncoding %s for gamma %f -> %s",in_RSI,&local_54,
                       (ColorEncodingHandle *)name);
            Log(Verbose,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color.cpp"
                ,0xed,local_50._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                       local_50.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        else {
          (name->_M_dataplus)._M_p = (pointer)0x0;
          (name->_M_dataplus)._M_p = (pointer)p_Var5[1]._M_parent;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_30);
        return (ColorEncodingHandle)
               (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                )name;
      }
      ErrorExit<std::__cxx11::string_const&>
                ("%s: expected \"gamma <value>\" for color encoding",in_RSI);
    }
    (name->_M_dataplus)._M_p = (pointer)0x0;
    pcVar2 = sRGB;
  }
  (name->_M_dataplus)._M_p = pcVar2;
  return (ColorEncodingHandle)
         (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )name;
}

Assistant:

const ColorEncodingHandle ColorEncodingHandle::Get(const std::string &name) {
    if (name == "linear")
        return Linear;
    else if (name == "sRGB")
        return sRGB;
    else {
        static std::map<float, ColorEncodingHandle> cache;

        std::vector<std::string> params = SplitStringsFromWhitespace(name);
        if (params.size() != 2 || params[0] != "gamma")
            ErrorExit("%s: expected \"gamma <value>\" for color encoding", name);
        Float gamma = atof(params[1].c_str());
        if (gamma == 0)
            ErrorExit("%s: unable to parse gamma value", params[1]);

        auto iter = cache.find(gamma);
        if (iter != cache.end())
            return iter->second;

        ColorEncodingHandle enc = new GammaColorEncoding(gamma);
        cache[gamma] = enc;
        LOG_VERBOSE("Added ColorEncoding %s for gamma %f -> %s", name, gamma, enc);
        return enc;
    }
}